

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O1

size_t __thiscall
kj::anon_unknown_0::MockInputStream::tryRead
          (MockInputStream *this,ArrayPtr<unsigned_char> buffer,size_t minBytes)

{
  size_t *psVar1;
  ulong uVar2;
  ulong __n;
  
  __n = this->blockSize;
  if (buffer.size_ <= this->blockSize) {
    __n = buffer.size_;
  }
  if (__n <= minBytes) {
    __n = minBytes;
  }
  uVar2 = (this->bytes).size_;
  if (uVar2 <= __n) {
    __n = uVar2;
  }
  memcpy(buffer.ptr,(this->bytes).ptr,__n);
  (this->bytes).ptr = (this->bytes).ptr + __n;
  psVar1 = &(this->bytes).size_;
  *psVar1 = *psVar1 - __n;
  return __n;
}

Assistant:

size_t tryRead(ArrayPtr<byte> buffer, size_t minBytes) override {
    // Clamp max read to blockSize.
    size_t n = kj::min(blockSize, buffer.size());

    // Unless that's less than minBytes -- in which case, use minBytes.
    n = kj::max(n, minBytes);

    // But also don't read more data than we have.
    n = kj::min(n, bytes.size());

    memcpy(buffer.begin(), bytes.begin(), n);
    bytes = bytes.slice(n, bytes.size());
    return n;
  }